

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

NetState * __thiscall caffe::NetParameter::mutable_state(NetParameter *this)

{
  NetState *this_00;
  NetParameter *this_local;
  
  set_has_state(this);
  if (this->state_ == (NetState *)0x0) {
    this_00 = (NetState *)operator_new(0x38);
    NetState::NetState(this_00);
    this->state_ = this_00;
  }
  return this->state_;
}

Assistant:

inline ::caffe::NetState* NetParameter::mutable_state() {
  set_has_state();
  if (state_ == NULL) {
    state_ = new ::caffe::NetState;
  }
  // @@protoc_insertion_point(field_mutable:caffe.NetParameter.state)
  return state_;
}